

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::PatchInitValueCantChangeType<Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  DynamicObject *pDVar2;
  Type *pTVar3;
  undefined1 local_49;
  undefined8 local_48;
  Type *oldType;
  Var newValue_local;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar1 = VarIs<Js::DynamicObject,Js::RecyclableObject>(object);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    local_48 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
  }
  else {
    local_48 = (Type *)0x0;
  }
  PatchInitValue<true,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  local_49 = false;
  if (local_48 != (Type *)0x0) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    pTVar3 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
    local_49 = local_48 != pTVar3;
  }
  return local_49;
}

Assistant:

inline bool JavascriptOperators::PatchInitValueCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValueCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchInitValueCantChangeType, Op_PatchInitValue);

        Type * oldType = VarIs<DynamicObject>(object) ? UnsafeVarTo<DynamicObject>(object)->GetType() : nullptr;
        PatchInitValue<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, object, propertyId, newValue);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(object)->GetType());

        JIT_HELPER_END(Op_PatchInitValueCantChangeType);
    }